

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void __thiscall
duckdb::HistogramBinState<bool>::InitializeBins<duckdb::HistogramFunctor>
          (HistogramBinState<bool> *this,Vector *bin_vector,idx_t count,idx_t pos,
          AggregateInputData *aggr_input)

{
  long lVar1;
  uint uVar2;
  size_type __n;
  sel_t *psVar3;
  _Bit_type *p_Var4;
  _Bit_type *p_Var5;
  unsafe_vector<bool> *puVar6;
  unsafe_vector<idx_t> *puVar7;
  Vector *this_00;
  idx_t count_00;
  long lVar8;
  BinderException *pBVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  vector<bool,_std::allocator<bool>_> *this_01;
  ulong uVar13;
  ulong uVar14;
  size_type sVar15;
  iterator __position;
  UnifiedVectorFormat bin_child_data;
  UnifiedVectorFormat bin_data;
  undefined1 local_e0 [16];
  SelectionVector local_d0 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_98;
  UnifiedVectorFormat local_78;
  
  puVar6 = (unsafe_vector<bool> *)operator_new(0x28);
  (puVar6->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = 0;
  *(undefined8 *)
   ((long)&(puVar6->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base + 8) = 0;
  (puVar6->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   ((long)&(puVar6->super_vector<bool,_std::allocator<bool>_>).
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base + 8) = 0;
  (puVar6->super_vector<bool,_std::allocator<bool>_>).super__Bvector_base<std::allocator<bool>_>.
  _M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  this->bin_boundaries = puVar6;
  puVar7 = (unsafe_vector<idx_t> *)operator_new(0x18);
  (puVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (puVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (puVar7->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->counts = puVar7;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(bin_vector,count,&local_78);
  if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
    pos = (idx_t)(local_78.sel)->sel_vector[pos];
  }
  uVar14 = *(ulong *)(local_78.data + pos * 0x10);
  __n = *(size_type *)(local_78.data + pos * 0x10 + 8);
  if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
       (unsigned_long *)0x0) &&
     ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[pos >> 6] >>
       (pos & 0x3f) & 1) == 0)) {
    pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
    local_e0._0_8_ = local_d0;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"Histogram bin list cannot be NULL","");
    BinderException::BinderException(pBVar9,(string *)local_e0);
    __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = ListVector::GetEntry(bin_vector);
  count_00 = ListVector::GetListSize(bin_vector);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_e0);
  Vector::ToUnifiedFormat(this_00,count_00,(UnifiedVectorFormat *)local_e0);
  ::std::vector<bool,_std::allocator<bool>_>::reserve
            ((vector<bool,_std::allocator<bool>_> *)this->bin_boundaries,__n);
  sVar15 = __n;
  while( true ) {
    if (sVar15 == 0) {
      puVar6 = this->bin_boundaries;
      p_Var4 = (puVar6->super_vector<bool,_std::allocator<bool>_>).
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
               super__Bit_iterator_base._M_p;
      p_Var5 = (puVar6->super_vector<bool,_std::allocator<bool>_>).
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p;
      uVar2 = *(uint *)((long)&(puVar6->super_vector<bool,_std::allocator<bool>_>).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
      if (uVar2 != 0 || p_Var4 != p_Var5) {
        uVar14 = ((long)p_Var5 - (long)p_Var4) * 8 + (ulong)uVar2;
        lVar8 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar8 == 0; lVar8 = lVar8 + -1) {
          }
        }
        ::std::__introsort_loop<std::_Bit_iterator,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var4,0,p_Var5,(ulong)uVar2,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
        ::std::__final_insertion_sort<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var4,0,p_Var5,uVar2);
      }
      this_01 = (vector<bool,_std::allocator<bool>_> *)this->bin_boundaries;
      lVar8 = *(long *)this_01;
      if (1 < (ulong)*(uint *)(this_01 + 0x18) + (*(long *)(this_01 + 0x10) - lVar8) * 8) {
        uVar14 = 1;
        do {
          uVar10 = uVar14 - 1;
          uVar12 = uVar14 + 0x3e;
          if (-1 < (long)uVar10) {
            uVar12 = uVar10;
          }
          uVar13 = uVar14 + 0x3f;
          if (-1 < (long)uVar14) {
            uVar13 = uVar14;
          }
          uVar11 = (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001);
          lVar1 = lVar8 + ((long)uVar13 >> 6) * 8;
          if (((*(ulong *)(lVar8 + ((long)uVar12 >> 6) * 8 + -8 +
                          (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                (uVar10 & 0x3f) & 1) != 0) !=
              ((*(ulong *)(lVar1 + -8 + uVar11 * 8) >> (uVar14 & 0x3f) & 1) == 0)) {
            __position.super__Bit_iterator_base._M_p = lVar1 + uVar11 * 8 + -8;
            __position.super__Bit_iterator_base._M_offset = (uint)uVar14 & 0x3f;
            __position.super__Bit_iterator_base._12_4_ = 0;
            ::std::vector<bool,_std::allocator<bool>_>::_M_erase(this_01,__position);
            uVar14 = uVar10;
          }
          uVar14 = uVar14 + 1;
          this_01 = (vector<bool,_std::allocator<bool>_> *)this->bin_boundaries;
          lVar8 = *(long *)this_01;
        } while (uVar14 < (ulong)*(uint *)(this_01 + 0x18) + (*(long *)(this_01 + 0x10) - lVar8) * 8
                );
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this->counts,__n + 1);
      if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      }
      if (local_d0[0].selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0[0].selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    psVar3 = ((SelectionVector *)local_e0._0_8_)->sel_vector;
    uVar10 = uVar14;
    if (psVar3 != (sel_t *)0x0) {
      uVar10 = (ulong)psVar3[uVar14];
    }
    if (((unsigned_long *)local_d0[0].sel_vector != (unsigned_long *)0x0) &&
       ((*(ulong *)((long)local_d0[0].sel_vector + (uVar10 >> 6) * 8) >> (uVar10 & 0x3f) & 1) == 0))
    break;
    uVar10 = uVar14;
    if (psVar3 != (sel_t *)0x0) {
      uVar10 = (ulong)psVar3[uVar14];
    }
    ::std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)this->bin_boundaries,
               *(bool *)(local_e0._8_8_ + uVar10));
    uVar14 = uVar14 + 1;
    sVar15 = sVar15 - 1;
  }
  pBVar9 = (BinderException *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Histogram bin entry cannot be NULL","");
  BinderException::BinderException(pBVar9,&local_98);
  __cxa_throw(pBVar9,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void InitializeBins(Vector &bin_vector, idx_t count, idx_t pos, AggregateInputData &aggr_input) {
		bin_boundaries = new unsafe_vector<T>();
		counts = new unsafe_vector<idx_t>();
		UnifiedVectorFormat bin_data;
		bin_vector.ToUnifiedFormat(count, bin_data);
		auto bin_counts = UnifiedVectorFormat::GetData<list_entry_t>(bin_data);
		auto bin_index = bin_data.sel->get_index(pos);
		auto bin_list = bin_counts[bin_index];
		if (!bin_data.validity.RowIsValid(bin_index)) {
			throw BinderException("Histogram bin list cannot be NULL");
		}

		auto &bin_child = ListVector::GetEntry(bin_vector);
		auto bin_count = ListVector::GetListSize(bin_vector);
		UnifiedVectorFormat bin_child_data;
		auto extra_state = OP::CreateExtraState(bin_count);
		OP::PrepareData(bin_child, bin_count, extra_state, bin_child_data);

		bin_boundaries->reserve(bin_list.length);
		for (idx_t i = 0; i < bin_list.length; i++) {
			auto bin_child_idx = bin_child_data.sel->get_index(bin_list.offset + i);
			if (!bin_child_data.validity.RowIsValid(bin_child_idx)) {
				throw BinderException("Histogram bin entry cannot be NULL");
			}
			bin_boundaries->push_back(OP::template ExtractValue<T>(bin_child_data, bin_list.offset + i, aggr_input));
		}
		// sort the bin boundaries
		std::sort(bin_boundaries->begin(), bin_boundaries->end());
		// ensure there are no duplicate bin boundaries
		for (idx_t i = 1; i < bin_boundaries->size(); i++) {
			if (Equals::Operation((*bin_boundaries)[i - 1], (*bin_boundaries)[i])) {
				bin_boundaries->erase_at(i);
				i--;
			}
		}

		counts->resize(bin_list.length + 1);
	}